

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::deinit
          (BasicVariousTessLevelsPosAttrCase *this)

{
  BasicVariousTessLevelsPosAttrCase *this_local;
  
  de::SharedPtr<const_glu::ShaderProgram>::clear(&this->m_program);
  return;
}

Assistant:

void BasicVariousTessLevelsPosAttrCase::deinit (void)
{
	m_program.clear();
}